

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *in_stack_00000028;
  FastText *in_stack_00000030;
  FastText fasttext;
  Args a;
  string asStack_228 [8];
  Args *in_stack_fffffffffffffde0;
  string local_208 [8];
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  Args *in_stack_fffffffffffffe20;
  FastText *in_stack_fffffffffffffe30;
  Args *in_stack_ffffffffffffff58;
  FastText *in_stack_ffffffffffffff60;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffe20);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 < 3) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(in_stack_fffffffffffffde0);
    exit(1);
  }
  ::fasttext::Args::parseArgs
            ((Args *)a._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)a._0_8_);
  ::fasttext::FastText::FastText(in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  ::fasttext::FastText::loadModel
            ((FastText *)
             fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(string *)
                    fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  std::__cxx11::string::~string(local_208);
  ::fasttext::FastText::quantize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  ::fasttext::FastText::saveModel(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(asStack_228);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}